

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  CType *pCVar1;
  CType *ct_00;
  CTypeID1 CVar2;
  IRType IVar3;
  CTSize CVar4;
  CTState *cts;
  CType *pCVar5;
  bool bVar6;
  IRType IVar7;
  TRef TVar8;
  TRef TVar9;
  uint uVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  IRType *pIVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  CTypeID1 CVar19;
  IRType IVar20;
  uint uVar21;
  TRef *pTVar22;
  IRType IVar23;
  CRecMemList ml [16];
  CTSize local_138;
  IRType local_134;
  TRef local_130 [64];
  
  if (-1 < (short)trlen) {
    IVar3 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (IVar3 == IRT_NIL) {
      return;
    }
    if (IVar3 < (IRT_GUARD|IRT_FALSE)) {
      IVar23 = IRT_NIL;
      if (ct == (CType *)0x0) {
        IVar7 = IRT_CDATA;
LAB_0015fa74:
        bVar11 = false;
        uVar13 = 8;
LAB_0015fa81:
        uVar16 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        IVar20 = ((uVar16 ^ 0x1f) * 2 ^ 0x3e) + IRT_U8;
        if (IVar7 != IRT_CDATA) {
          IVar20 = IVar7;
        }
        uVar12 = 0;
        do {
          if (IVar23 + uVar13 <= IVar3) {
            uVar17 = uVar12;
            if ((uint)uVar12 < 0x11) {
              uVar17 = 0x10;
            }
            pIVar14 = &local_134 + uVar12 * 4;
            lVar18 = 0;
            do {
              if (uVar12 - uVar17 == lVar18) {
                uVar16 = 0;
                goto LAB_0015fb04;
              }
              pIVar14[-1] = IVar23;
              *pIVar14 = IVar20;
              lVar18 = lVar18 + -1;
              pIVar14 = pIVar14 + 4;
              IVar23 = IVar23 + uVar13;
            } while (IVar23 + uVar13 <= IVar3);
            uVar12 = (ulong)((uint)uVar12 - (int)lVar18);
          }
          uVar16 = (uint)uVar12;
          uVar13 = uVar13 >> 1;
          IVar20 = IVar20 - IRT_TRUE;
        } while (IVar23 < IVar3);
      }
      else {
        cts = *(CTState **)&J[-1].penalty[0x3c].val;
        uVar13 = ct->info;
        if ((uVar13 & 0xf0000000) == 0x30000000) {
          IVar7 = crec_ct2irt(cts,cts->tab + (ushort)ct->info);
          if (IVar7 == IRT_CDATA) {
            uVar16 = 0;
            uVar13 = 1;
            iVar15 = 3;
          }
          else {
            uVar13 = (uint)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                           [IVar7];
            iVar15 = 0;
            uVar16 = 0;
          }
        }
        else if ((uVar13 >> 0x17 & 1) == 0) {
          iVar15 = 4;
          IVar7 = IRT_CDATA;
          if (ct->sib == 0) {
            uVar16 = 0;
            uVar13 = 1;
          }
          else {
            pCVar5 = cts->tab;
            uVar16 = 0;
            CVar19 = ct->sib;
            do {
              CVar2 = pCVar5[CVar19].sib;
              uVar13 = pCVar5[CVar19].info >> 0x1c;
              if (uVar13 == 0xb) {
LAB_0015f9f3:
                bVar11 = false;
              }
              else {
                bVar11 = true;
                if (uVar13 == 9) {
                  pCVar1 = pCVar5 + CVar19;
                  if ((pCVar1->name).gcptr64 == 0) {
                    bVar11 = false;
                    bVar6 = false;
                  }
                  else {
                    ct_00 = pCVar5 + (ushort)pCVar1->info;
                    uVar13 = ct_00->info;
                    IVar7 = crec_ct2irt(cts,ct_00);
                    bVar6 = false;
                    bVar11 = true;
                    if ((IVar7 != IRT_CDATA) && (uVar16 < 0x10)) {
                      CVar4 = pCVar1->size;
                      (&local_138)[(ulong)uVar16 * 4] = CVar4;
                      (&local_134)[(ulong)uVar16 * 4] = IVar7;
                      uVar10 = uVar16 + 1;
                      bVar6 = true;
                      if ((uVar13 & 0xf4000000) == 0x34000000) {
                        if (uVar16 == 0xf) {
                          bVar6 = false;
                          uVar16 = 0x10;
                          goto LAB_0015f9ef;
                        }
                        (&local_138)[(ulong)uVar10 * 4] = (ct_00->size >> 1) + CVar4;
                        (&local_134)[(ulong)uVar10 * 4] = IVar7;
                        uVar10 = uVar16 + 2;
                      }
                      bVar11 = false;
                      uVar16 = uVar10;
                    }
                  }
LAB_0015f9ef:
                  if (bVar6) goto LAB_0015f9f3;
                }
              }
              IVar7 = IRT_CDATA;
              iVar15 = 4;
              uVar13 = 1;
              if (bVar11) {
                uVar16 = 0;
                break;
              }
              CVar19 = CVar2;
            } while (CVar2 != 0);
          }
        }
        else {
          uVar13 = 1 << ((byte)(uVar13 >> 0x10) & 0xf);
          uVar16 = 0;
          iVar15 = 3;
          IVar7 = IRT_CDATA;
        }
        bVar11 = true;
        if (iVar15 == 0) goto LAB_0015fa81;
        if (iVar15 != 4) {
          if (iVar15 != 3) goto LAB_0015fc6b;
          goto LAB_0015fa74;
        }
      }
LAB_0015fb04:
      if (uVar16 != 0) {
        uVar21 = 1;
        uVar13 = 0;
        uVar10 = 0;
        uVar12 = 0;
        do {
          TVar8 = lj_ir_kint64(J,(ulong)(&local_138)[uVar12 * 4]);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          TVar9 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)(&local_134)[uVar12 * 4] | 0x4600;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = 0;
          TVar9 = lj_opt_fold(J);
          local_130[uVar12 * 4 + 1] = TVar9;
          local_130[uVar12 * 4] = TVar8;
          uVar17 = uVar12 + 1;
          uVar10 = uVar10 + 1;
          if ((3 < uVar10) || (uVar16 <= uVar17)) {
            uVar10 = 0;
            if (uVar13 <= uVar12) {
              pTVar22 = local_130 + (ulong)uVar13 * 4 + 1;
              do {
                TVar8 = pTVar22[0xffffffffffffffff];
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)trdst;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                TVar9 = lj_opt_fold(J);
                TVar8 = *pTVar22;
                (J->fold).ins.field_0.ot = (ushort)pTVar22[0xfffffffffffffffe] | 0x4e00;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                lj_opt_fold(J);
                uVar13 = uVar13 + 1;
                pTVar22 = pTVar22 + 4;
              } while (uVar21 != uVar13);
              uVar10 = 0;
              uVar13 = uVar21;
            }
          }
          uVar21 = uVar21 + 1;
          uVar12 = uVar17;
        } while (uVar17 != uVar16);
        if (bVar11) {
          return;
        }
        goto LAB_0015fc80;
      }
    }
  }
LAB_0015fc6b:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
LAB_0015fc80:
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lj_assertJ(ctype_isarray(ct->info) || ctype_isstruct(ct->info),
		 "copy of non-aggregate");
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lj_assertJ((len & (step-1)) == 0, "copy of fractional size");
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}